

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cc
# Opt level: O1

int XlearnDataFree(DataHandle *out)

{
  DMatrix *this;
  ostream *poVar1;
  Logger local_64;
  string local_60;
  string local_40;
  
  if (out != (DataHandle *)0x0) {
    xLearn::DMatrix::Reset((DMatrix *)*out);
    this = (DMatrix *)*out;
    if (this != (DMatrix *)0x0) {
      xLearn::DMatrix::~DMatrix(this);
      operator_delete(this);
    }
    return 0;
  }
  local_64.severity_ = ERR;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,
             "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/c_api/c_api.cc"
             ,"");
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"XlearnDataFree","");
  poVar1 = Logger::Start(ERR,&local_40,0x87,&local_60);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"CHECK failed ",0xd);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/c_api/c_api.cc"
             ,0x5c);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,":",1);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,0x87);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"out",3);
  std::operator<<(poVar1," == NULL \n");
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  Logger::~Logger(&local_64);
  abort();
}

Assistant:

XL_DLL int XlearnDataFree(DataHandle* out) {
  API_BEGIN();
  CHECK_NOTNULL(out);
  reinterpret_cast<xLearn::DMatrix*>(*out)->Reset();
  delete reinterpret_cast<xLearn::DMatrix*>(*out);
  API_END();
}